

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zetMetricGroupCreateExp
          (zet_device_handle_t hDevice,char *pName,char *pDescription,
          zet_metric_group_sampling_type_flags_t samplingType,
          zet_metric_group_handle_t *phMetricGroup)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_94;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = context;
  uVar7 = *(ulong *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zetMetricGroupCreateExp(hDevice, pName, pDescription, samplingType, phMetricGroup)",""
            );
  if (*(char *)(uVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(uVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar6 + 0x790);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar6 + 0xd30);
    lVar6 = *(long *)(lVar6 + 0xd38);
    uVar8 = lVar6 - lVar3 >> 3;
    bVar10 = lVar6 != lVar3;
    if (bVar10) {
      uVar9 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar9 * 8) + 0x10);
        zVar5 = (**(code **)(*plVar4 + 0x3f0))
                          (plVar4,hDevice,pName,pDescription,samplingType,phMetricGroup);
        if (zVar5 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetMetricGroupCreateExp",zVar5);
          uVar7 = (ulong)zVar5;
          break;
        }
        bVar10 = uVar9 < uVar8;
        lVar1 = uVar9 + (-(ulong)(uVar8 == 0) - uVar8);
        uVar9 = uVar9 + 1;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    local_94 = (ze_result_t)uVar7;
    if (bVar10) {
      return local_94;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZETHandleLifetimeValidation::zetMetricGroupCreateExpPrologue
                          ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                           hDevice,pName,pDescription,samplingType,phMetricGroup),
       zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zetMetricGroupCreateExp",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hDevice,pName,pDescription,samplingType,phMetricGroup);
    bVar10 = lVar6 != lVar3;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(lVar1 + 0xd30) + -8 + uVar7 * 8) + 0x10);
        result = (**(code **)(*plVar4 + 0x3f8))
                           (plVar4,hDevice,pName,pDescription,samplingType,phMetricGroup,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetMetricGroupCreateExp",result);
          local_94 = result;
          break;
        }
        bVar10 = uVar7 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar6 != 0);
    }
    if (bVar10) {
      return local_94;
    }
    if (((zVar5 == ZE_RESULT_SUCCESS) && (phMetricGroup != (zet_metric_group_handle_t *)0x0)) &&
       (*(char *)(lVar1 + 4) != '\0')) {
      HandleLifetimeValidation::addHandle
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phMetricGroup);
      HandleLifetimeValidation::addDependent
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hDevice,*phMetricGroup);
    }
  }
  logAndPropagateResult("zetMetricGroupCreateExp",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCreateExp(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        const char* pName,                              ///< [in] pointer to metric group name. Must point to a null-terminated
                                                        ///< character array no longer than ::ZET_MAX_METRIC_GROUP_NAME.
        const char* pDescription,                       ///< [in] pointer to metric group description. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_GROUP_DESCRIPTION.
        zet_metric_group_sampling_type_flags_t samplingType,///< [in] Sampling type for the metric group.
        zet_metric_group_handle_t* phMetricGroup        ///< [in,out] Created Metric group handle
        )
    {
        context.logger->log_trace("zetMetricGroupCreateExp(hDevice, pName, pDescription, samplingType, phMetricGroup)");

        auto pfnCreateExp = context.zetDdiTable.MetricGroupExp.pfnCreateExp;

        if( nullptr == pfnCreateExp )
            return logAndPropagateResult("zetMetricGroupCreateExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricGroupCreateExpPrologue( hDevice, pName, pDescription, samplingType, phMetricGroup );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupCreateExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricGroupCreateExpPrologue( hDevice, pName, pDescription, samplingType, phMetricGroup );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupCreateExp", result);
        }

        auto driver_result = pfnCreateExp( hDevice, pName, pDescription, samplingType, phMetricGroup );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricGroupCreateExpEpilogue( hDevice, pName, pDescription, samplingType, phMetricGroup ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupCreateExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phMetricGroup){
                context.handleLifetime->addHandle( *phMetricGroup );
                context.handleLifetime->addDependent( hDevice, *phMetricGroup );

            }
        }
        return logAndPropagateResult("zetMetricGroupCreateExp", driver_result);
    }